

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duel.h
# Opt level: O2

uint __thiscall duel::pickCard(duel *this,hand *hand__,bool blast)

{
  bool bVar1;
  uint uVar2;
  ostream *poVar3;
  undefined7 in_register_00000011;
  char *pcVar4;
  string temp;
  string local_50;
  
  std::operator<<((ostream *)&std::cout,"Play a card: ");
  hand::printHand_abi_cxx11_(&local_50,hand__);
  std::__cxx11::string::~string((string *)&local_50);
  temp._M_dataplus._M_p = (pointer)&temp.field_2;
  temp._M_string_length = 0;
  temp.field_2._M_local_buf[0] = '\0';
  if ((int)CONCAT71(in_register_00000011,blast) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Pick a card between ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,1);
    poVar3 = std::operator<<(poVar3," and ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    pcVar4 = " .";
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"Pick a card from your opponent\'s hand from ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,1);
    poVar3 = std::operator<<(poVar3," to ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    pcVar4 = " to discard.";
  }
  poVar3 = std::operator<<(poVar3,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar3);
  uVar2 = 0;
  while ((uVar2 == 0 ||
         ((ulong)(((long)(hand__->hand_).super__Vector_base<card,_std::allocator<card>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(hand__->hand_).super__Vector_base<card,_std::allocator<card>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x30) < (ulong)uVar2))) {
    std::operator>>((istream *)&std::cin,(string *)&temp);
    bVar1 = is_number(&temp);
    if (bVar1) {
      uVar2 = std::__cxx11::stoi(&temp,(size_t *)0x0,10);
    }
    if ((uVar2 == 0) ||
       ((ulong)(((long)(hand__->hand_).super__Vector_base<card,_std::allocator<card>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(hand__->hand_).super__Vector_base<card,_std::allocator<card>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x30) < (ulong)uVar2)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"card must be between ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,1);
      poVar3 = std::operator<<(poVar3," and ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3," .");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
  }
  std::__cxx11::string::~string((string *)&temp);
  return uVar2 - 1;
}

Assistant:

unsigned int duel::pickCard(hand& hand__,bool blast) {
    cout << "Play a card: ";
    // list the player's hand
    hand__.printHand();
    string temp;
    unsigned int position = 0;
    if(blast) cout << "Pick a card from your opponent's hand from " << 1 << " to " << hand__.hand_.size()<< " to discard." << endl;
    else cout << "Pick a card between " << 1 << " and " << hand__.hand_.size() << " ." << endl;
    // repeats if position is out of bounds
    while (!((1 <= position) && (position <= hand__.hand_.size()))) {
        cin >> temp;
        if (is_number(temp)) position = static_cast<unsigned int>(stoi(temp));
        if (!((1 <= position) && (position <= hand__.hand_.size()))) {
            cout << "card must be between " << 1 << " and " << hand__.hand_.size() << " ." << endl;
        }
    }
    return (position-1);
}